

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTiming.cc
# Opt level: O3

int main(void)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  bool local_309;
  vector<double,_std::allocator<double>_> x;
  OutputFunction local_2e0 [2];
  vector<double,_std::allocator<double>_> local_2d8;
  vector<int,_std::allocator<int>_> arch;
  code *local_2a8 [2];
  code *local_298;
  code *local_290;
  function<double_(const_double_&)> local_288;
  vector<double,_std::allocator<double>_> local_268;
  vector<double,_std::allocator<double>_> local_250;
  FeedForwardNN<double> nn;
  
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x500000003;
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x300000005;
  __l._M_len = 4;
  __l._M_array = (iterator)&nn;
  std::vector<int,_std::allocator<int>_>::vector(&arch,__l,(allocator_type *)&x);
  local_2e0[1] = 0;
  local_2e0[0] = ACTIVATION;
  local_309 = true;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2a8[1] = (code *)0x0;
  local_2a8[0] = nnad::Sigmoid<double>;
  local_290 = std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::_M_invoke
  ;
  local_298 = std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
              _M_manager;
  local_288.super__Function_base._M_functor._8_8_ = 0;
  local_288.super__Function_base._M_functor._M_unused._M_object = nnad::dSigmoid<double>;
  local_288._M_invoker =
       std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::_M_invoke;
  local_288.super__Function_base._M_manager =
       std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::_M_manager;
  nnad::FeedForwardNN<double>::FeedForwardNN
            (&nn,&arch,(int *)(local_2e0 + 1),&local_309,
             (function<double_(const_double_&)> *)local_2a8,&local_288,local_2e0,(Preprocessing *)&x
             ,&local_2d8);
  if (local_288.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_288.super__Function_base._M_manager)
              ((_Any_data *)&local_288,(_Any_data *)&local_288,__destroy_functor);
  }
  if (local_298 != (_Manager_type)0x0) {
    (*local_298)((_Any_data *)local_2a8,(_Any_data *)local_2a8,__destroy_functor);
  }
  if (local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    (*(code *)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage)(&x,&x,3);
  }
  local_2a8[0] = (code *)0x3fb999999999999a;
  local_2a8[1] = (code *)0x4002666666666666;
  local_298 = (_Manager_type)0x4012000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_2a8;
  std::vector<double,_std::allocator<double>_>::vector(&x,__l_00,(allocator_type *)&local_288);
  iVar4 = 500000;
  lVar1 = std::chrono::_V2::steady_clock::now();
  do {
    nnad::FeedForwardNN<double>::Evaluate(&local_250,&nn,&x);
    if (local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  lVar2 = std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Time elepsed taken for ",0x17);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,500000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," evaluations of the NN: ",0x18);
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  iVar4 = 500000;
  lVar1 = std::chrono::_V2::steady_clock::now();
  do {
    nnad::FeedForwardNN<double>::Derive(&local_268,&nn,&x);
    if (local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  lVar2 = std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Time elepsed taken for ",0x17);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,500000);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3," evaluations of the NN and its derivatives: ",0x2c);
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds\n",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  nnad::FeedForwardNN<double>::~FeedForwardNN(&nn);
  if (arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
  // Define architecture
  const std::vector<int> arch{3, 5, 5, 3};

  // Initialise NN
  const nnad::FeedForwardNN<double> nn{arch, 0, nnad::OutputFunction::ACTIVATION, true};

  // Input vector
  std::vector<double> x{0.1, 2.3, 4.5};

  // Number of calls
  const int ncalls = 500000;

  // Start timer
  auto start{std::chrono::steady_clock::now()};

  // Get NN at x
  for (int i = 0; i < ncalls; i++)
    nn.Evaluate(x);

  // Stop timer
  std::chrono::duration<double> elapsed_seconds{std::chrono::steady_clock::now() - start};

  // Report time
  std::cout << "Time elepsed taken for " << ncalls << " evaluations of the NN: " << elapsed_seconds.count() << " seconds" << std::endl;

  // Start timer
  start = std::chrono::steady_clock::now();

  // Compare NN derivatives at x
  for (int i = 0; i < ncalls; i++)
    nn.Derive(x);

  // Stop timer
  elapsed_seconds = std::chrono::steady_clock::now() - start;

  // Report time
  std::cout << "Time elepsed taken for " << ncalls << " evaluations of the NN and its derivatives: " << elapsed_seconds.count() << " seconds\n" << std::endl;

  return 0;
}